

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

int32_t __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy>::
do_run_mode(jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy> *this,
           int32_t index,encoder_strategy *param_2)

{
  ushort uVar1;
  pixel_type *ppVar2;
  pixel_type *ppVar3;
  sample_type sVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint run_length;
  uint run_length_00;
  ulong uVar8;
  
  run_length = this->width_ - index;
  ppVar2 = this->current_line_;
  lVar6 = (long)index;
  ppVar3 = this->previous_line_;
  uVar1 = ppVar2[lVar6 + -1];
  lVar7 = 0;
  uVar8 = 0;
  do {
    if (ppVar2[lVar6 + uVar8] != uVar1) {
      run_length_00 = (uint)uVar8;
      encode_run_pixels(this,run_length_00,run_length == run_length_00);
      if (run_length == run_length_00) {
        return run_length;
      }
      lVar7 = lVar7 >> 0x1f;
      sVar4 = encode_run_interruption_pixel
                        (this,(uint)*(ushort *)((long)ppVar2 + lVar7 + lVar6 * 2),(uint)uVar1,
                         (uint)*(ushort *)((long)ppVar3 + lVar7 + lVar6 * 2));
      *(sample_type *)((long)ppVar2 + lVar7 + lVar6 * 2) = sVar4;
      iVar5 = 1;
      if (1 < this->run_index_) {
        iVar5 = this->run_index_;
      }
      this->run_index_ = iVar5 + -1;
      return run_length_00 + 1;
    }
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 0x100000000;
  } while (run_length != uVar8);
  encode_run_pixels(this,run_length,true);
  return run_length;
}

Assistant:

int32_t do_run_mode(const int32_t index, encoder_strategy* /*strategy*/)
    {
        const int32_t count_type_remain = width_ - index;
        pixel_type* type_cur_x{current_line_ + index};
        const pixel_type* type_prev_x{previous_line_ + index};

        const pixel_type ra{type_cur_x[-1]};

        int32_t run_length{};
        while (traits_.is_near(type_cur_x[run_length], ra))
        {
            type_cur_x[run_length] = ra;
            ++run_length;

            if (run_length == count_type_remain)
                break;
        }

        encode_run_pixels(run_length, run_length == count_type_remain);

        if (run_length == count_type_remain)
            return run_length;

        type_cur_x[run_length] = encode_run_interruption_pixel(type_cur_x[run_length], ra, type_prev_x[run_length]);
        decrement_run_index();
        return run_length + 1;
    }